

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

void Js::JavascriptOperators::AddFloatsToArraySegment
               (SparseArraySegment<double> *segment,AuxArray<double> *doubles)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  uVar1 = doubles->count;
  if ((segment->super_SparseArraySegmentBase).left != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1819,"(segment->left == 0)","segment->left == 0");
    if (!bVar3) goto LAB_00ac2efe;
    *puVar4 = 0;
  }
  if ((segment->super_SparseArraySegmentBase).size < uVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x181a,"(count <= segment->size)","count <= segment->size");
    if (!bVar3) {
LAB_00ac2efe:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if ((segment->super_SparseArraySegmentBase).length < uVar1) {
    (segment->super_SparseArraySegmentBase).length = uVar1;
    SparseArraySegmentBase::CheckLengthvsSize(&segment->super_SparseArraySegmentBase);
  }
  js_memcpy_s(segment + 1,(ulong)(segment->super_SparseArraySegmentBase).length << 3,doubles + 1,
              (ulong)uVar1 * 8);
  return;
}

Assistant:

void JavascriptOperators::AddFloatsToArraySegment(SparseArraySegment<double> * segment, const Js::AuxArray<double> *doubles)
    {
        uint32 count = doubles->count;

        Assert(segment->left == 0);
        Assert(count <= segment->size);

        if(count > segment->length)
        {
            segment->length = count;
            segment->CheckLengthvsSize();
        }
        js_memcpy_s(segment->elements, sizeof(double) * segment->length, doubles->elements, sizeof(double) * count);
    }